

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::
     RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterYs<short>,ImPlot::GetterYRef,ImPlot::TransformerLogLin>>
               (ShadedRenderer<ImPlot::GetterYs<short>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
                *renderer,ImDrawList *DrawList,ImRect *cull_rect)

{
  bool bVar1;
  int prim;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ImVec2 uv;
  ImVec2 local_48;
  uint local_3c;
  ulong local_38;
  
  uVar4 = renderer->Prims;
  local_48 = DrawList->_Data->TexUvWhitePixel;
  if (uVar4 == 0) {
    uVar6 = 0;
  }
  else {
    prim = 0;
    uVar6 = 0;
    do {
      uVar3 = ~DrawList->_VtxCurrentIdx / 5;
      if (uVar4 < uVar3) {
        uVar3 = uVar4;
      }
      uVar2 = (ulong)uVar3;
      uVar5 = 0x40;
      if (uVar4 < 0x40) {
        uVar5 = uVar4;
      }
      if (~DrawList->_VtxCurrentIdx / 5 < uVar5) {
        if (uVar6 != 0) {
          ImDrawList::PrimUnreserve(DrawList,uVar6 * 6,uVar6 * 5);
        }
        uVar2 = 0x33333333;
        if (uVar4 < 0x33333333) {
          uVar2 = (ulong)uVar4;
        }
        ImDrawList::PrimReserve(DrawList,(int)uVar2 * 6,(int)uVar2 * 5);
        uVar5 = 0;
      }
      else {
        uVar5 = uVar6 - uVar3;
        if (uVar6 < uVar3) {
          ImDrawList::PrimReserve(DrawList,(uVar3 - uVar6) * 6,(uVar3 - uVar6) * 5);
          uVar5 = 0;
        }
      }
      uVar3 = (uint)uVar2;
      local_38 = uVar2;
      local_3c = uVar4;
      uVar6 = uVar5;
      while (uVar3 != 0) {
        bVar1 = ShadedRenderer<ImPlot::GetterYs<short>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
                ::operator()(renderer,DrawList,cull_rect,&local_48,prim);
        uVar6 = uVar6 + !bVar1;
        prim = prim + 1;
        uVar3 = (int)uVar2 - 1;
        uVar2 = (ulong)uVar3;
      }
      uVar4 = local_3c - (int)local_38;
    } while (uVar4 != 0);
  }
  if (uVar6 != 0) {
    ImDrawList::PrimUnreserve(DrawList,uVar6 * 6,uVar6 * 5);
  }
  return;
}

Assistant:

inline void RenderPrimitives(const Renderer& renderer, ImDrawList& DrawList, const ImRect& cull_rect) {
    unsigned int prims        = renderer.Prims;
    unsigned int prims_culled = 0;
    unsigned int idx          = 0;
    const ImVec2 uv = DrawList._Data->TexUvWhitePixel;
    while (prims) {
        // find how many can be reserved up to end of current draw command's limit
        unsigned int cnt = ImMin(prims, (MaxIdx<ImDrawIdx>::Value - DrawList._VtxCurrentIdx) / Renderer::VtxConsumed);
        // make sure at least this many elements can be rendered to avoid situations where at the end of buffer this slow path is not taken all the time
        if (cnt >= ImMin(64u, prims)) {
            if (prims_culled >= cnt)
                prims_culled -= cnt; // reuse previous reservation
            else {
                DrawList.PrimReserve((cnt - prims_culled) * Renderer::IdxConsumed, (cnt - prims_culled) * Renderer::VtxConsumed); // add more elements to previous reservation
                prims_culled = 0;
            }
        }
        else
        {
            if (prims_culled > 0) {
                DrawList.PrimUnreserve(prims_culled * Renderer::IdxConsumed, prims_culled * Renderer::VtxConsumed);
                prims_culled = 0;
            }
            cnt = ImMin(prims, (MaxIdx<ImDrawIdx>::Value - 0/*DrawList._VtxCurrentIdx*/) / Renderer::VtxConsumed);
            DrawList.PrimReserve(cnt * Renderer::IdxConsumed, cnt * Renderer::VtxConsumed); // reserve new draw command
        }
        prims -= cnt;
        for (unsigned int ie = idx + cnt; idx != ie; ++idx) {
            if (!renderer(DrawList, cull_rect, uv, idx))
                prims_culled++;
        }
    }
    if (prims_culled > 0)
        DrawList.PrimUnreserve(prims_culled * Renderer::IdxConsumed, prims_culled * Renderer::VtxConsumed);
}